

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O0

void __thiscall
TxRequestTracker::Impl::SetTimePoint
          (Impl *this,microseconds now,
          vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_> *expired)

{
  long lVar1;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
  it_00;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
  it_01;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
  it_02;
  bool bVar2;
  State SVar3;
  strong_ordering sVar4;
  Announcement *pAVar5;
  Iter<ByTxHash> in_RDX;
  Impl *in_RDI;
  long in_FS_OFFSET;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
  it_1;
  iterator it;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
  *in_stack_ffffffffffffff28;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
  in_stack_ffffffffffffff30;
  type in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined7 in_stack_ffffffffffffff70;
  Iter<ByTxHash> it_03;
  Iter<ByTxHash> in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX.node !=
      (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
       *)0x0) {
    std::vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_>::clear
              ((vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_> *)
               in_stack_ffffffffffffff28);
  }
LAB_0148378c:
  do {
    bVar2 = boost::multi_index::detail::
            ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
            ::empty((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                     *)in_stack_ffffffffffffff28);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    boost::multi_index::
    multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
    ::get<(anonymous_namespace)::ByTime>
              ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
                *)in_stack_ffffffffffffff28);
    boost::multi_index::detail::
    ordered_index_impl<(anonymous_namespace)::ByTimeViewExtractor,_std::less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>,_boost::multi_index::detail::nth_layer<3,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTime,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
    ::begin((ordered_index_impl<(anonymous_namespace)::ByTimeViewExtractor,_std::less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>,_boost::multi_index::detail::nth_layer<3,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTime,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
             *)in_stack_ffffffffffffff40.node);
    boost::operators_impl::
    dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
    ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                  *)in_stack_ffffffffffffff28);
    SVar3 = anon_unknown.dwarf_237ecec::Announcement::GetState
                      ((Announcement *)in_stack_ffffffffffffff28);
    if (SVar3 == CANDIDATE_DELAYED) {
      boost::operators_impl::
      dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
      ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                    *)in_stack_ffffffffffffff28);
      sVar4 = _GLOBAL__N_1::std::chrono::
              operator<=><long,_std::ratio<1L,_1000000L>,_long,_std::ratio<1L,_1000000L>_>
                        ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffff40.node
                         ,(duration<long,_std::ratio<1L,_1000000L>_> *)in_RDI);
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)in_stack_ffffffffffffff28,(__unspec *)0x148381a);
      bVar2 = std::operator<=(sVar4._M_value);
      if (bVar2) {
        it_00.node._7_1_ = in_stack_ffffffffffffff4f;
        it_00.node._0_7_ = in_stack_ffffffffffffff48;
        boost::multi_index::
        multi_index_container<(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>
        ::
        project<(anonymous_namespace)::ByTxHash,boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,std::allocator<(anonymous_namespace)::Announcement>>>>>
                  ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
                    *)in_RDI,it_00);
        PromoteCandidateReady
                  ((Impl *)CONCAT17(sVar4._M_value,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffffb8);
        goto LAB_0148378c;
      }
    }
    boost::operators_impl::
    dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
    ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                  *)in_stack_ffffffffffffff28);
    SVar3 = anon_unknown.dwarf_237ecec::Announcement::GetState
                      ((Announcement *)in_stack_ffffffffffffff28);
    if (SVar3 != REQUESTED) break;
    boost::operators_impl::
    dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
    ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                  *)in_stack_ffffffffffffff28);
    sVar4 = _GLOBAL__N_1::std::chrono::
            operator<=><long,_std::ratio<1L,_1000000L>,_long,_std::ratio<1L,_1000000L>_>
                      ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffff40.node,
                       (duration<long,_std::ratio<1L,_1000000L>_> *)in_RDI);
    std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_ffffffffffffff28,(__unspec *)0x14838bc);
    bVar2 = std::operator<=(sVar4._M_value);
    if (!bVar2) break;
    it_03.node = in_RDX.node;
    if (in_RDX.node !=
        (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
         *)0x0) {
      pAVar5 = boost::operators_impl::
               dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
               ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                             *)in_RDX.node);
      in_stack_ffffffffffffff30.node =
           (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>
            *)&pAVar5->m_peer;
      boost::multi_index::detail::
      bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
      ::operator*((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>
                   *)in_RDX.node);
      anon_unknown.dwarf_237ecec::ToGenTxid((Announcement *)in_RDI);
      std::vector<std::pair<long,GenTxid>,std::allocator<std::pair<long,GenTxid>>>::
      emplace_back<long_const&,GenTxid>
                ((vector<std::pair<long,_GenTxid>,_std::allocator<std::pair<long,_GenTxid>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 (long *)in_stack_ffffffffffffff40.node,(GenTxid *)in_RDI);
      in_stack_ffffffffffffff28 = in_RDX.node;
    }
    it_01.node._7_1_ = in_stack_ffffffffffffff4f;
    it_01.node._0_7_ = in_stack_ffffffffffffff48;
    boost::multi_index::
    multi_index_container<(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>
    ::
    project<(anonymous_namespace)::ByTxHash,boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,std::allocator<(anonymous_namespace)::Announcement>>>>>
              ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
                *)in_RDI,it_01);
    MakeCompleted(in_RDI,it_03);
    in_RDX.node = it_03.node;
  } while( true );
LAB_0148396a:
  bVar2 = boost::multi_index::detail::
          ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::empty((ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                   *)in_stack_ffffffffffffff28);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_01483a4a:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
      __stack_chk_fail();
    }
    return;
  }
  boost::multi_index::
  multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
  ::get<(anonymous_namespace)::ByTime>
            ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
              *)in_stack_ffffffffffffff28);
  boost::multi_index::detail::
  ordered_index_impl<(anonymous_namespace)::ByTimeViewExtractor,_std::less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>,_boost::multi_index::detail::nth_layer<3,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTime,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
  ::end((ordered_index_impl<(anonymous_namespace)::ByTimeViewExtractor,_std::less<std::pair<(anonymous_namespace)::WaitState,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>_>,_boost::multi_index::detail::nth_layer<3,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTime,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
         *)in_stack_ffffffffffffff40.node);
  std::
  prev<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,std::allocator<(anonymous_namespace)::Announcement>>>>>
            (in_stack_ffffffffffffff30,(difference_type)in_stack_ffffffffffffff28);
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
  ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                *)in_stack_ffffffffffffff28);
  bVar2 = anon_unknown.dwarf_237ecec::Announcement::IsSelectable((Announcement *)in_RDI);
  if (!bVar2) goto LAB_01483a4a;
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
  ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                *)in_stack_ffffffffffffff28);
  sVar4 = _GLOBAL__N_1::std::chrono::
          operator<=><long,_std::ratio<1L,_1000000L>,_long,_std::ratio<1L,_1000000L>_>
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_ffffffffffffff40.node,
                     (duration<long,_std::ratio<1L,_1000000L>_> *)in_RDI);
  std::__cmp_cat::__unspec::__unspec((__unspec *)in_stack_ffffffffffffff28,(__unspec *)0x14839fe);
  bVar2 = std::operator>(sVar4._M_value);
  if (!bVar2) goto LAB_01483a4a;
  it_02.node._7_1_ = sVar4._M_value;
  it_02.node._0_7_ = in_stack_ffffffffffffff48;
  in_stack_ffffffffffffff40 =
       boost::multi_index::
       multi_index_container<(anonymous_namespace)::Announcement,(anonymous_namespace)::Announcement_Indices,std::allocator<(anonymous_namespace)::Announcement>>
       ::
       project<(anonymous_namespace)::ByTxHash,boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,std::allocator<(anonymous_namespace)::Announcement>>>>>
                 ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
                   *)in_RDI,it_02);
  ChangeAndReselect((Impl *)in_stack_ffffffffffffff40.node,in_RDX,(State)((ulong)in_RDI >> 0x38));
  goto LAB_0148396a;
}

Assistant:

void SetTimePoint(std::chrono::microseconds now, std::vector<std::pair<NodeId, GenTxid>>* expired)
    {
        if (expired) expired->clear();

        // Iterate over all CANDIDATE_DELAYED and REQUESTED from old to new, as long as they're in the past,
        // and convert them to CANDIDATE_READY and COMPLETED respectively.
        while (!m_index.empty()) {
            auto it = m_index.get<ByTime>().begin();
            if (it->GetState() == State::CANDIDATE_DELAYED && it->m_time <= now) {
                PromoteCandidateReady(m_index.project<ByTxHash>(it));
            } else if (it->GetState() == State::REQUESTED && it->m_time <= now) {
                if (expired) expired->emplace_back(it->m_peer, ToGenTxid(*it));
                MakeCompleted(m_index.project<ByTxHash>(it));
            } else {
                break;
            }
        }

        while (!m_index.empty()) {
            // If time went backwards, we may need to demote CANDIDATE_BEST and CANDIDATE_READY announcements back
            // to CANDIDATE_DELAYED. This is an unusual edge case, and unlikely to matter in production. However,
            // it makes it much easier to specify and test TxRequestTracker::Impl's behaviour.
            auto it = std::prev(m_index.get<ByTime>().end());
            if (it->IsSelectable() && it->m_time > now) {
                ChangeAndReselect(m_index.project<ByTxHash>(it), State::CANDIDATE_DELAYED);
            } else {
                break;
            }
        }
    }